

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

HashErr insert_symbol(SymbolTable *s,char *name,SymbolInfo val)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Bucket *__ptr;
  int iVar4;
  int iVar5;
  Symbol *pSVar6;
  
  uVar2 = hash_code(name);
  cVar1 = *name;
  __ptr = s->bucket[uVar2];
  iVar4 = __ptr->num_symbols;
  pSVar6 = __ptr->symbol;
  iVar5 = iVar4;
  while( true ) {
    if (iVar5 < 1) {
      iVar5 = __ptr->max_symbols;
      if (iVar5 <= iVar4) {
        __ptr->max_symbols = iVar5 * 2;
        __ptr = (Bucket *)realloc(__ptr,(long)iVar5 << 5 | 8);
        s->bucket[uVar2] = __ptr;
        iVar4 = __ptr->num_symbols;
      }
      __ptr->num_symbols = iVar4 + 1;
      __ptr->symbol[iVar4].name = name;
      __ptr->symbol[iVar4].value = val;
      return HASH_NOERR;
    }
    if ((cVar1 == *pSVar6->name) && (iVar3 = strcmp(name,pSVar6->name), iVar3 == 0)) break;
    pSVar6 = pSVar6 + 1;
    iVar5 = iVar5 + -1;
  }
  return HASH_DUPLICATE;
}

Assistant:

HashErr
insert_symbol (SymbolTable *s, const char *name, SymbolInfo val)
{
  int i, bucket_num = hash_code (name);
  Symbol *sym;
  Bucket *b;
  char firstc = *name;

  b = s->bucket[bucket_num];
  
  /* First, check for a duplicate. */
  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      return HASH_DUPLICATE;

  /* If there isn't room, double the size of the bucket. */
  if (b->num_symbols >= b->max_symbols)
    {
      b->max_symbols *= 2;
      b = s->bucket[bucket_num] =
	(Bucket *) realloc (b, sizeof *b + ((b->max_symbols - INITIAL_SYMBOLS)
					    * sizeof (Symbol)));
    }

  sym = &b->symbol[b->num_symbols++];
  sym->name = name;
  sym->value = val;

  return HASH_NOERR;
}